

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

uint capnp::(anonymous_namespace)::checkRoundTrip<unsigned_int,double>(double value)

{
  double dVar1;
  Fault local_20;
  Fault f;
  double dStack_10;
  uint result;
  double value_local;
  
  f.exception._4_4_ = (uint)(long)value;
  dVar1 = (double)((long)value & 0xffffffff);
  if ((dVar1 != value) || (NAN(dVar1) || NAN(value))) {
    dStack_10 = value;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],double&>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x6ca,FAILED,"U(result) == value",
               "\"Value out-of-range for requested type.\", value",
               (char (*) [39])"Value out-of-range for requested type.",&stack0xfffffffffffffff0);
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  return f.exception._4_4_;
}

Assistant:

T checkRoundTrip(U value) {
#if __aarch64__
  // Work around an apparently broken compiler optimization on Clang / arm64. It appears that
  // for T = int8_t, U = double, and value = 128, the compiler incorrectly believes that the
  // round-trip does not change the value, where in fact it should change to -128. Similar problems
  // exist for various other types and inputs -- json-test seems to exercise several problem cases.
  // The problem only exists when compiling with optimization. In any case, declaring the variable
  // `volatile` kills the optimization.
  volatile
#endif
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}